

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoelrefpattern.h
# Opt level: O0

int __thiscall
TPZGeoElRefPattern<pzgeom::TPZEllipse3D>::ClassId(TPZGeoElRefPattern<pzgeom::TPZEllipse3D> *this)

{
  uint uVar1;
  int iVar2;
  TPZGeoElRefLess<pzgeom::TPZEllipse3D> *in_stack_00000140;
  string *in_stack_ffffffffffffffc0;
  allocator<char> *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  uVar1 = Hash(in_stack_ffffffffffffffc0);
  iVar2 = TPZGeoElRefLess<pzgeom::TPZEllipse3D>::ClassId(in_stack_00000140);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffd8);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffd7);
  return uVar1 ^ iVar2 << 1;
}

Assistant:

int TPZGeoElRefPattern<TGeo>::ClassId() const{
    return Hash("TPZGeoElRefPattern") ^ TPZGeoElRefLess<TGeo>::ClassId() << 1;
}